

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzFind.c
# Opt level: O0

UInt32 Bt3_MatchFinder_GetMatches(CMatchFinder *p,UInt32 *distances)

{
  uint lenLimit_00;
  UInt32 curMatch_00;
  byte *pbVar1;
  long lVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  UInt32 *pUVar7;
  uint *in_RSI;
  long *in_RDI;
  Byte *lim;
  Byte *c;
  ptrdiff_t diff;
  UInt32 temp;
  UInt32 curMatch;
  Byte *cur;
  UInt32 hv;
  UInt32 lenLimit;
  UInt32 *hash;
  UInt32 pos;
  UInt32 offset;
  UInt32 maxLen;
  UInt32 d2;
  UInt32 h2;
  byte *local_68;
  uint local_30;
  UInt32 local_2c;
  UInt32 local_c;
  
  lenLimit_00 = *(uint *)((long)in_RDI + 0x14);
  if (lenLimit_00 < 3) {
    MatchFinder_MovePos((CMatchFinder *)0x120fe8);
    local_c = 0;
  }
  else {
    pbVar1 = (byte *)*in_RDI;
    uVar3 = *(uint *)((long)in_RDI + (ulong)*pbVar1 * 4 + 0x78) ^ (uint)pbVar1[1];
    uVar4 = uVar3 & 0x3ff;
    uVar3 = (uVar3 ^ (uint)pbVar1[2] << 8) & *(uint *)(in_RDI + 7);
    lVar2 = in_RDI[5];
    iVar6 = (int)in_RDI[1];
    uVar5 = iVar6 - *(int *)(lVar2 + (ulong)uVar4 * 4);
    curMatch_00 = *(UInt32 *)(lVar2 + (ulong)(uVar3 + 0x400) * 4);
    *(int *)(lVar2 + (ulong)uVar4 * 4) = iVar6;
    *(int *)(lVar2 + (ulong)(uVar3 + 0x400) * 4) = iVar6;
    local_2c = 2;
    local_30 = 0;
    if ((uVar5 < *(uint *)((long)in_RDI + 0x1c)) && (pbVar1[-(ulong)uVar5] == *pbVar1)) {
      for (local_68 = pbVar1 + 2;
          (local_68 != pbVar1 + lenLimit_00 && (local_68[-(ulong)uVar5] == *local_68));
          local_68 = local_68 + 1) {
      }
      local_2c = (int)local_68 - (int)pbVar1;
      *in_RSI = local_2c;
      in_RSI[1] = uVar5 - 1;
      local_30 = 2;
      if (local_2c == lenLimit_00) {
        SkipMatchesSpec(lenLimit_00,curMatch_00,*(UInt32 *)(in_RDI + 1),(Byte *)*in_RDI,
                        (CLzRef *)in_RDI[6],*(UInt32 *)(in_RDI + 3),*(UInt32 *)((long)in_RDI + 0x1c)
                        ,*(UInt32 *)((long)in_RDI + 0x3c));
        *(int *)(in_RDI + 3) = (int)in_RDI[3] + 1;
        *in_RDI = *in_RDI + 1;
        iVar6 = (int)in_RDI[1] + 1;
        *(int *)(in_RDI + 1) = iVar6;
        if (iVar6 == *(int *)((long)in_RDI + 0xc)) {
          MatchFinder_CheckLimits((CMatchFinder *)0x12126b);
        }
        return 2;
      }
    }
    pUVar7 = GetMatchesSpec1(lenLimit_00,curMatch_00,*(UInt32 *)(in_RDI + 1),(Byte *)*in_RDI,
                             (CLzRef *)in_RDI[6],*(UInt32 *)(in_RDI + 3),
                             *(UInt32 *)((long)in_RDI + 0x1c),*(UInt32 *)((long)in_RDI + 0x3c),
                             in_RSI + local_30,local_2c);
    local_c = (UInt32)((long)pUVar7 - (long)in_RSI >> 2);
    *(int *)(in_RDI + 3) = (int)in_RDI[3] + 1;
    *in_RDI = *in_RDI + 1;
    iVar6 = (int)in_RDI[1] + 1;
    *(int *)(in_RDI + 1) = iVar6;
    if (iVar6 == *(int *)((long)in_RDI + 0xc)) {
      MatchFinder_CheckLimits((CMatchFinder *)0x121352);
    }
  }
  return local_c;
}

Assistant:

static UInt32 Bt3_MatchFinder_GetMatches(CMatchFinder *p, UInt32 *distances)
{
  UInt32 h2, d2, maxLen, offset, pos;
  UInt32 *hash;
  GET_MATCHES_HEADER(3)

  HASH3_CALC;

  hash = p->hash;
  pos = p->pos;

  d2 = pos - hash[h2];

  curMatch = hash[kFix3HashSize + hv];
  
  hash[h2] = pos;
  hash[kFix3HashSize + hv] = pos;

  maxLen = 2;
  offset = 0;

  if (d2 < p->cyclicBufferSize && *(cur - d2) == *cur)
  {
    UPDATE_maxLen
    distances[0] = maxLen;
    distances[1] = d2 - 1;
    offset = 2;
    if (maxLen == lenLimit)
    {
      SkipMatchesSpec(lenLimit, curMatch, MF_PARAMS(p));
      MOVE_POS_RET;
    }
  }
  
  GET_MATCHES_FOOTER(offset, maxLen)
}